

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O3

void Pla_ManDumpBlif(Pla_Man_t *p,char *pFileName)

{
  size_t __n;
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  FILE *__s;
  char *pcVar5;
  void *__s_00;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  uVar8 = (p->vDivs).nSize;
  if ((ulong)uVar8 == 0) {
    uVar11 = p->nIns;
  }
  else if ((int)uVar8 < 1) {
    uVar11 = 0;
  }
  else {
    uVar7 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + ((p->vDivs).pArray[uVar7] == 0);
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    pcVar5 = "Cannot open file \"%s\" for writing.\n";
  }
  else {
    fwrite("# BLIF file written via PLA package in ABC on ",0x2e,1,__s);
    pcVar5 = Extra_TimeStamp();
    fputs(pcVar5,__s);
    fwrite("\n\n",2,1,__s);
    fprintf(__s,".model %s\n",p->pName);
    fwrite(".inputs",7,1,__s);
    if (0 < (int)uVar11) {
      uVar7 = 0;
      do {
        fprintf(__s," i%d",uVar7);
        uVar8 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar8;
      } while (uVar11 != uVar8);
    }
    fputc(10,__s);
    fwrite(".outputs o",10,1,__s);
    fputc(10,__s);
    fwrite(".names",6,1,__s);
    if (0 < p->nIns) {
      uVar7 = 0;
      do {
        fprintf(__s," i%d",uVar7);
        uVar8 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar8;
      } while ((int)uVar8 < p->nIns);
    }
    fwrite(" o\n",3,1,__s);
    iVar1 = p->nIns;
    __n = (long)iVar1 + 1;
    iVar4 = 0x10;
    if (0xe < (ulong)(long)iVar1) {
      iVar4 = (int)__n;
    }
    if (iVar4 == 0) {
      __s_00 = (void *)0x0;
    }
    else {
      __s_00 = malloc((long)iVar4);
    }
    memset(__s_00,0,__n);
    if (0 < (p->vCubeLits).nSize) {
      iVar4 = -1;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      lVar9 = 0;
      do {
        pVVar3 = (p->vCubeLits).pArray;
        iVar2 = p->nIns;
        if (0 < (long)iVar2) {
          uVar7 = 0;
          do {
            if (iVar4 + 1 == uVar7) goto LAB_00370866;
            *(undefined1 *)((long)__s_00 + uVar7) = 0x2d;
            uVar7 = uVar7 + 1;
          } while ((long)iVar2 != uVar7);
        }
        if (0 < pVVar3[lVar9].nSize) {
          lVar6 = 0;
          do {
            uVar8 = pVVar3[lVar9].pArray[lVar6];
            if ((int)uVar8 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            if (iVar1 < (int)(uVar8 >> 1)) {
LAB_00370866:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                            ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
            }
            *(byte *)((long)__s_00 + (ulong)(uVar8 >> 1)) = (byte)uVar8 & 1 ^ 0x31;
            lVar6 = lVar6 + 1;
          } while (lVar6 < pVVar3[lVar9].nSize);
        }
        fprintf(__s,"%s 1\n",__s_00);
        lVar9 = lVar9 + 1;
      } while (lVar9 < (p->vCubeLits).nSize);
    }
    if (__s_00 != (void *)0x0) {
      free(__s_00);
    }
    if ((int)uVar11 < (p->vDivs).nSize) {
      uVar7 = (ulong)uVar11;
      do {
        if ((int)uVar11 < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = (p->vDivs).pArray[uVar7];
        fwrite(".names",6,1,__s);
        fprintf(__s," i%d",(ulong)(uVar8 >> 3 & 0x1ff));
        fprintf(__s," i%d",(ulong)(uVar8 >> 0xd & 0x1ff));
        uVar10 = uVar8 & 3;
        if (uVar10 == 3) {
          fprintf(__s," i%d",(ulong)(uVar8 >> 0x17));
          fprintf(__s," i%d\n",uVar7 & 0xffffffff);
          if ((uVar8 >> 0xc & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(pLits[1])",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                          ,0x8f,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
          }
          if ((uVar8 >> 0x16 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(pLits[2])",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                          ,0x90,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
          }
          fprintf(__s,"%d-0 1\n-11 1\n",(ulong)(~(uVar8 >> 2) & 1));
        }
        else {
          fprintf(__s," i%d\n",uVar7 & 0xffffffff);
          if (uVar10 == 2) {
            if ((uVar8 & 4) != 0) {
              __assert_fail("!Abc_LitIsCompl(pLits[0])",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                            ,0x89,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
            }
            if ((uVar8 >> 0xc & 1) != 0) {
              __assert_fail("!Abc_LitIsCompl(pLits[1])",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                            ,0x8a,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
            }
            fwrite("10 1\n01 1\n",10,1,__s);
          }
          else {
            if (uVar10 != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                            ,0x93,"void Pla_ManDumpBlif(Pla_Man_t *, char *)");
            }
            fprintf(__s,"%d%d 1\n",(ulong)(~(uVar8 >> 2) & 1),(ulong)(~(uVar8 >> 0xc) & 1));
          }
        }
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < (p->vDivs).nSize);
    }
    fwrite(".end\n\n",6,1,__s);
    fclose(__s);
    pcVar5 = "Written file \"%s\".\n";
  }
  printf(pcVar5,pFileName);
  return;
}

Assistant:

void Pla_ManDumpBlif( Pla_Man_t * p, char * pFileName )
{
    // find the number of original variables
    int nVarsInit = Pla_ManDivNum(p) ? Vec_IntCountZero(&p->vDivs) : Pla_ManInNum(p);
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
    else
    {
        //char * pLits = "-01?";
        Vec_Str_t * vStr;
        Vec_Int_t * vCube;
        int i, k, Lit, Div;
        // comment
        fprintf( pFile, "# BLIF file written via PLA package in ABC on " );
        fprintf( pFile, "%s", Extra_TimeStamp() );
        fprintf( pFile, "\n\n" );
        // header
        fprintf( pFile, ".model %s\n", Pla_ManName(p) );
        fprintf( pFile, ".inputs" );
        for ( i = 0; i < nVarsInit; i++ )
            fprintf( pFile, " i%d", i );
        fprintf( pFile, "\n" );
        fprintf( pFile, ".outputs o" );
        fprintf( pFile, "\n" );
        // SOP
        fprintf( pFile, ".names" );
        for ( i = 0; i < Pla_ManInNum(p); i++ )
            fprintf( pFile, " i%d", i );
        fprintf( pFile, " o\n" );
        vStr = Vec_StrStart( Pla_ManInNum(p) + 1 );
        Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
        {
            for ( k = 0; k < Pla_ManInNum(p); k++ )
                Vec_StrWriteEntry( vStr, k, '-' );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit) ? '0' : '1') );
            fprintf( pFile, "%s 1\n", Vec_StrArray(vStr) );
        }
        Vec_StrFree( vStr );
        // divisors
        Vec_IntForEachEntryStart( &p->vDivs, Div, i, nVarsInit )
        {
            int pLits[3] = { (Div >> 2) & 0x3FF, (Div >> 12) & 0x3FF, (Div >> 22) & 0x3FF };
            fprintf( pFile, ".names" );
            fprintf( pFile, " i%d", Abc_Lit2Var(pLits[0]) );
            fprintf( pFile, " i%d", Abc_Lit2Var(pLits[1]) );
            if ( (Div & 3) == 3 ) // MUX
                fprintf( pFile, " i%d", Abc_Lit2Var(pLits[2]) );
            fprintf( pFile, " i%d\n", i );
            if ( (Div & 3) == 1 ) // AND
                fprintf( pFile, "%d%d 1\n", !Abc_LitIsCompl(pLits[0]), !Abc_LitIsCompl(pLits[1]) );
            else if ( (Div & 3) == 2 ) // XOR
            {
                assert( !Abc_LitIsCompl(pLits[0]) );
                assert( !Abc_LitIsCompl(pLits[1]) );
                fprintf( pFile, "10 1\n01 1\n" );
            }
            else if ( (Div & 3) == 3 ) // MUX
            {
                assert( !Abc_LitIsCompl(pLits[1]) );
                assert( !Abc_LitIsCompl(pLits[2]) );
                fprintf( pFile, "%d-0 1\n-11 1\n", !Abc_LitIsCompl(pLits[0]) );
            }
            else assert( 0 );
        }
        fprintf( pFile, ".end\n\n" );
        fclose( pFile );
        printf( "Written file \"%s\".\n", pFileName );
    }
}